

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::EquivScannerMixinT<1U>::Match
          (EquivScannerMixinT<1U> *this,Matcher *matcher,char16 *input,CharCount inputLength,
          CharCount *inputOffset)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((((matcher->program).ptr)->rep).insts.litbufLen -
      (this->super_ScannerMixin).super_LiteralMixin.offset <
      (this->super_ScannerMixin).super_LiteralMixin.length << 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x2ae,
                       "(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset)"
                       ,
                       "length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  bVar2 = TextbookBoyerMoore<char16_t>::Match<4u,1u>
                    (&(this->super_ScannerMixin).scanner,input,inputLength,inputOffset,
                     (((matcher->program).ptr)->rep).insts.litbuf.ptr +
                     (this->super_ScannerMixin).super_LiteralMixin.offset,
                     (this->super_ScannerMixin).super_LiteralMixin.length,matcher->stats);
  return bVar2;
}

Assistant:

inline bool EquivScannerMixinT<lastPatCharEquivClassSize>::Match(Matcher& matcher, const char16* const input, const CharCount inputLength, CharCount& inputOffset) const
    {
        Assert(length * CaseInsensitive::EquivClassSize <= matcher.program->rep.insts.litbufLen - offset);
        CompileAssert(lastPatCharEquivClassSize >= 1 && lastPatCharEquivClassSize <= CaseInsensitive::EquivClassSize);
        return scanner.Match<CaseInsensitive::EquivClassSize, lastPatCharEquivClassSize>(
            input
            , inputLength
            , inputOffset
            , matcher.program->rep.insts.litbuf + offset
            , length
#if ENABLE_REGEX_CONFIG_OPTIONS
            , matcher.stats
#endif
            );
    }